

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::LimitingInputStream::Next(LimitingInputStream *this,void **data,int *size)

{
  uint uVar1;
  int *size_local;
  void **data_local;
  LimitingInputStream *this_local;
  
  if (this->limit_ < 1) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (*this->input_->_vptr_ZeroCopyInputStream[2])(this->input_,data,size);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->limit_ = this->limit_ - (long)*size;
      if (this->limit_ < 0) {
        *size = *size + (int)this->limit_;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LimitingInputStream::Next(const void** data, int* size) {
  if (limit_ <= 0) return false;
  if (!input_->Next(data, size)) return false;

  limit_ -= *size;
  if (limit_ < 0) {
    // We overshot the limit.  Reduce *size to hide the rest of the buffer.
    *size += limit_;
  }
  return true;
}